

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O3

void __thiscall
btDbvtBroadphase::performDeferredRemoval(btDbvtBroadphase *this,btDispatcher *dispatcher)

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  btBroadphasePair *pbVar6;
  undefined8 uVar7;
  int iVar8;
  btAlignedObjectArray<btBroadphasePair> *this_00;
  btBroadphasePair *pbVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  undefined8 *puVar16;
  long lVar17;
  btDbvtProxy *pb;
  btBroadphasePairSortPredicate local_4a;
  btBroadphasePairSortPredicate local_49;
  btAlignedObjectArray<btBroadphasePair> *local_48;
  btDispatcher *local_40;
  long local_38;
  undefined4 extraout_var;
  
  local_40 = dispatcher;
  iVar8 = (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
            [0xe])();
  if ((char)iVar8 != '\0') {
    iVar8 = (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
              [7])();
    this_00 = (btAlignedObjectArray<btBroadphasePair> *)CONCAT44(extraout_var,iVar8);
    iVar8 = this_00->m_size;
    if (1 < iVar8) {
      btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                (this_00,&local_49,0,iVar8 + -1);
      iVar8 = this_00->m_size;
    }
    if (0 < iVar8) {
      lVar17 = 0;
      lVar13 = 0;
      iVar14 = 0;
      lVar10 = 0;
      lVar12 = 0;
      local_48 = this_00;
      do {
        pbVar9 = local_48->m_data;
        lVar15 = *(long *)((long)&pbVar9->m_pProxy0 + lVar17);
        lVar3 = *(long *)((long)&pbVar9->m_pProxy1 + lVar17);
        if (lVar12 == lVar3 && lVar10 == lVar15) {
LAB_0013591b:
          puVar16 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar17);
          local_38 = lVar15;
          (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[8])
                    (this->m_paircache,puVar16,local_40);
          iVar14 = iVar14 + 1;
          *puVar16 = 0;
          puVar16[1] = 0;
          iVar8 = local_48->m_size;
          lVar15 = local_38;
        }
        else {
          pfVar4 = *(float **)(lVar15 + 0x40);
          pfVar5 = *(float **)(lVar3 + 0x40);
          if (((((pfVar5[4] < *pfVar4) || (pfVar4[4] < *pfVar5)) || (pfVar5[5] < pfVar4[1])) ||
              ((pfVar4[5] < pfVar5[1] || (pfVar5[6] < pfVar4[2])))) || (pfVar4[6] < pfVar5[2]))
          goto LAB_0013591b;
        }
        this_00 = local_48;
        lVar13 = lVar13 + 1;
        lVar17 = lVar17 + 0x20;
        lVar10 = lVar15;
        lVar12 = lVar3;
      } while (lVar13 < iVar8);
      iVar11 = iVar8;
      if (1 < iVar8) {
        btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                  (local_48,&local_4a,0,iVar8 + -1);
        iVar11 = this_00->m_size;
      }
      iVar8 = iVar11 - iVar14;
      if (iVar14 < 0) {
        if (this_00->m_capacity < iVar8) {
          if (iVar11 == iVar14) {
            pbVar9 = (btBroadphasePair *)0x0;
          }
          else {
            pbVar9 = (btBroadphasePair *)btAlignedAllocInternal((long)iVar8 << 5,0x10);
            iVar2 = this_00->m_size;
            if (0 < (long)iVar2) {
              lVar10 = 0;
              do {
                pbVar6 = this_00->m_data;
                puVar16 = (undefined8 *)((long)&pbVar6->m_pProxy0 + lVar10);
                uVar7 = puVar16[1];
                puVar1 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar10);
                *puVar1 = *puVar16;
                puVar1[1] = uVar7;
                *(undefined8 *)((long)&pbVar9->m_algorithm + lVar10) =
                     *(undefined8 *)((long)&pbVar6->m_algorithm + lVar10);
                *(undefined8 *)((long)&pbVar9->field_3 + lVar10) =
                     *(undefined8 *)((long)&pbVar6->field_3 + lVar10);
                lVar10 = lVar10 + 0x20;
              } while ((long)iVar2 * 0x20 != lVar10);
            }
          }
          if ((this_00->m_data != (btBroadphasePair *)0x0) && (this_00->m_ownsMemory == true)) {
            btAlignedFreeInternal(this_00->m_data);
          }
          this_00->m_ownsMemory = true;
          this_00->m_data = pbVar9;
          this_00->m_capacity = iVar8;
        }
        lVar12 = (long)iVar14;
        lVar10 = (long)iVar11 << 5;
        do {
          pbVar9 = this_00->m_data;
          puVar16 = (undefined8 *)((long)&pbVar9->m_algorithm + lVar10);
          *puVar16 = 0;
          puVar16[1] = 0;
          puVar16 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar10);
          *puVar16 = 0;
          puVar16[1] = 0;
          lVar10 = lVar10 + 0x20;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0);
      }
    }
    this_00->m_size = iVar8;
  }
  return;
}

Assistant:

void btDbvtBroadphase::performDeferredRemoval(btDispatcher* dispatcher)
{

	if (m_paircache->hasDeferredRemoval())
	{

		btBroadphasePairArray&	overlappingPairArray = m_paircache->getOverlappingPairArray();

		//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		int invalidPair = 0;

		
		int i;

		btBroadphasePair previousPair;
		previousPair.m_pProxy0 = 0;
		previousPair.m_pProxy1 = 0;
		previousPair.m_algorithm = 0;
		
		
		for (i=0;i<overlappingPairArray.size();i++)
		{
		
			btBroadphasePair& pair = overlappingPairArray[i];

			bool isDuplicate = (pair == previousPair);

			previousPair = pair;

			bool needsRemoval = false;

			if (!isDuplicate)
			{
				//important to perform AABB check that is consistent with the broadphase
				btDbvtProxy*		pa=(btDbvtProxy*)pair.m_pProxy0;
				btDbvtProxy*		pb=(btDbvtProxy*)pair.m_pProxy1;
				bool hasOverlap = Intersect(pa->leaf->volume,pb->leaf->volume);

				if (hasOverlap)
				{
					needsRemoval = false;
				} else
				{
					needsRemoval = true;
				}
			} else
			{
				//remove duplicate
				needsRemoval = true;
				//should have no algorithm
				btAssert(!pair.m_algorithm);
			}
			
			if (needsRemoval)
			{
				m_paircache->cleanOverlappingPair(pair,dispatcher);

				pair.m_pProxy0 = 0;
				pair.m_pProxy1 = 0;
				invalidPair++;
			} 
			
		}

		//perform a sort, to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());
		overlappingPairArray.resize(overlappingPairArray.size() - invalidPair);
	}
}